

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int register_pmeth_gost(int id,EVP_PKEY_METHOD **pmeth,int flags)

{
  EVP_PKEY_METHOD *pEVar1;
  int in_EDX;
  long *in_RSI;
  int in_EDI;
  
  pEVar1 = EVP_PKEY_meth_new(in_EDI,in_EDX);
  *in_RSI = (long)pEVar1;
  if (*in_RSI == 0) {
    return 0;
  }
  if (in_EDI != 0x32b) {
    if (in_EDI == 0x32f) {
      EVP_PKEY_meth_set_ctrl((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_ctrl,pkey_gost_mac_ctrl_str);
      EVP_PKEY_meth_set_signctx
                ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_signctx_init,pkey_gost_mac_signctx);
      EVP_PKEY_meth_set_keygen((EVP_PKEY_METHOD *)*in_RSI,(keygen_init *)0x0,pkey_gost_mac_keygen);
      EVP_PKEY_meth_set_init((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_init);
      EVP_PKEY_meth_set_cleanup((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_cleanup);
      EVP_PKEY_meth_set_copy((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_copy);
      return 1;
    }
    if (in_EDI != 0x331) {
      if (in_EDI == 0x3d0) {
        EVP_PKEY_meth_set_ctrl((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_ctrl,pkey_gost_mac_ctrl_str)
        ;
        EVP_PKEY_meth_set_signctx
                  ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_signctx_init,pkey_gost_mac_signctx);
        EVP_PKEY_meth_set_keygen
                  ((EVP_PKEY_METHOD *)*in_RSI,(keygen_init *)0x0,pkey_gost_mac_keygen_12);
        EVP_PKEY_meth_set_init((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_init);
        EVP_PKEY_meth_set_cleanup((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_cleanup);
        EVP_PKEY_meth_set_copy((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_copy);
        return 1;
      }
      if (in_EDI == 0x3d3) {
        EVP_PKEY_meth_set_ctrl((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_ctrl,pkey_gost_ec_ctrl_str_256);
        EVP_PKEY_meth_set_sign((EVP_PKEY_METHOD *)*in_RSI,(sign_init *)0x0,pkey_gost_ec_cp_sign);
        EVP_PKEY_meth_set_verify
                  ((EVP_PKEY_METHOD *)*in_RSI,(verify_init *)0x0,pkey_gost_ec_cp_verify);
        EVP_PKEY_meth_set_keygen
                  ((EVP_PKEY_METHOD *)*in_RSI,(keygen_init *)0x0,pkey_gost2012cp_keygen);
        EVP_PKEY_meth_set_encrypt
                  ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_encrypt_init,pkey_gost_encrypt);
        EVP_PKEY_meth_set_decrypt((EVP_PKEY_METHOD *)*in_RSI,(decrypt_init *)0x0,pkey_gost_decrypt);
        EVP_PKEY_meth_set_derive
                  ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_derive_init,pkey_gost_ec_derive);
        EVP_PKEY_meth_set_paramgen
                  ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_paramgen_init,pkey_gost2012_paramgen);
        EVP_PKEY_meth_set_check(*in_RSI,pkey_gost_check);
        EVP_PKEY_meth_set_public_check(*in_RSI,pkey_gost_check);
      }
      else {
        if (in_EDI != 0x3d4) {
          if ((in_EDI != 0x3f9) && (in_EDI != 0x49a)) {
            if (in_EDI != 0x4a8) {
              return 0;
            }
            EVP_PKEY_meth_set_ctrl
                      ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_magma_mac_ctrl,
                       pkey_gost_magma_mac_ctrl_str);
            EVP_PKEY_meth_set_signctx
                      ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_magma_mac_signctx_init,
                       pkey_gost_mac_signctx);
            EVP_PKEY_meth_set_keygen
                      ((EVP_PKEY_METHOD *)*in_RSI,(keygen_init *)0x0,pkey_gost_magma_mac_keygen);
            EVP_PKEY_meth_set_init((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_magma_mac_init);
            EVP_PKEY_meth_set_cleanup((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_cleanup);
            EVP_PKEY_meth_set_copy((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_copy);
            return 1;
          }
          EVP_PKEY_meth_set_ctrl
                    ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_grasshopper_mac_ctrl,
                     pkey_gost_grasshopper_mac_ctrl_str);
          EVP_PKEY_meth_set_signctx
                    ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_grasshopper_mac_signctx_init,
                     pkey_gost_mac_signctx);
          EVP_PKEY_meth_set_keygen
                    ((EVP_PKEY_METHOD *)*in_RSI,(keygen_init *)0x0,pkey_gost_grasshopper_mac_keygen)
          ;
          EVP_PKEY_meth_set_init((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_grasshopper_mac_init);
          EVP_PKEY_meth_set_cleanup((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_cleanup);
          EVP_PKEY_meth_set_copy((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_mac_copy);
          return 1;
        }
        EVP_PKEY_meth_set_ctrl((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_ctrl,pkey_gost_ec_ctrl_str_512);
        EVP_PKEY_meth_set_sign((EVP_PKEY_METHOD *)*in_RSI,(sign_init *)0x0,pkey_gost_ec_cp_sign);
        EVP_PKEY_meth_set_verify
                  ((EVP_PKEY_METHOD *)*in_RSI,(verify_init *)0x0,pkey_gost_ec_cp_verify);
        EVP_PKEY_meth_set_keygen
                  ((EVP_PKEY_METHOD *)*in_RSI,(keygen_init *)0x0,pkey_gost2012cp_keygen);
        EVP_PKEY_meth_set_encrypt
                  ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_encrypt_init,pkey_gost_encrypt);
        EVP_PKEY_meth_set_decrypt((EVP_PKEY_METHOD *)*in_RSI,(decrypt_init *)0x0,pkey_gost_decrypt);
        EVP_PKEY_meth_set_derive
                  ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_derive_init,pkey_gost_ec_derive);
        EVP_PKEY_meth_set_paramgen
                  ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_paramgen_init,pkey_gost2012_paramgen);
        EVP_PKEY_meth_set_check(*in_RSI,pkey_gost_check);
        EVP_PKEY_meth_set_public_check(*in_RSI,pkey_gost_check);
      }
      goto LAB_001170b2;
    }
  }
  EVP_PKEY_meth_set_ctrl((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_ctrl,pkey_gost_ec_ctrl_str_256);
  EVP_PKEY_meth_set_sign((EVP_PKEY_METHOD *)*in_RSI,(sign_init *)0x0,pkey_gost_ec_cp_sign);
  EVP_PKEY_meth_set_verify((EVP_PKEY_METHOD *)*in_RSI,(verify_init *)0x0,pkey_gost_ec_cp_verify);
  EVP_PKEY_meth_set_keygen((EVP_PKEY_METHOD *)*in_RSI,(keygen_init *)0x0,pkey_gost2001cp_keygen);
  EVP_PKEY_meth_set_encrypt((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_encrypt_init,pkey_gost_encrypt);
  EVP_PKEY_meth_set_decrypt((EVP_PKEY_METHOD *)*in_RSI,(decrypt_init *)0x0,pkey_gost_decrypt);
  EVP_PKEY_meth_set_derive((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_derive_init,pkey_gost_ec_derive);
  EVP_PKEY_meth_set_paramgen
            ((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_paramgen_init,pkey_gost2001_paramgen);
  EVP_PKEY_meth_set_check(*in_RSI,pkey_gost_check);
  EVP_PKEY_meth_set_public_check(*in_RSI,pkey_gost_check);
LAB_001170b2:
  EVP_PKEY_meth_set_init((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_init);
  EVP_PKEY_meth_set_cleanup((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_cleanup);
  EVP_PKEY_meth_set_copy((EVP_PKEY_METHOD *)*in_RSI,pkey_gost_copy);
  return 1;
}

Assistant:

int register_pmeth_gost(int id, EVP_PKEY_METHOD **pmeth, int flags)
{
    *pmeth = EVP_PKEY_meth_new(id, flags);
    if (!*pmeth)
        return 0;

    switch (id) {
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
        EVP_PKEY_meth_set_ctrl(*pmeth,
                               pkey_gost_ctrl, pkey_gost_ec_ctrl_str_256);
        EVP_PKEY_meth_set_sign(*pmeth, NULL, pkey_gost_ec_cp_sign);
        EVP_PKEY_meth_set_verify(*pmeth, NULL, pkey_gost_ec_cp_verify);

        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost2001cp_keygen);

        EVP_PKEY_meth_set_encrypt(*pmeth,
                                  pkey_gost_encrypt_init,
                                  pkey_gost_encrypt);
        EVP_PKEY_meth_set_decrypt(*pmeth, NULL, pkey_gost_decrypt);
        EVP_PKEY_meth_set_derive(*pmeth,
                                 pkey_gost_derive_init, pkey_gost_ec_derive);
        EVP_PKEY_meth_set_paramgen(*pmeth, pkey_gost_paramgen_init,
                                   pkey_gost2001_paramgen);
    EVP_PKEY_meth_set_check(*pmeth, pkey_gost_check);
    EVP_PKEY_meth_set_public_check(*pmeth, pkey_gost_check);
        break;
    case NID_id_GostR3410_2012_256:
        EVP_PKEY_meth_set_ctrl(*pmeth,
                               pkey_gost_ctrl, pkey_gost_ec_ctrl_str_256);
        EVP_PKEY_meth_set_sign(*pmeth, NULL, pkey_gost_ec_cp_sign);
        EVP_PKEY_meth_set_verify(*pmeth, NULL, pkey_gost_ec_cp_verify);

        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost2012cp_keygen);

        EVP_PKEY_meth_set_encrypt(*pmeth,
                                  pkey_gost_encrypt_init,
                                  pkey_gost_encrypt);
        EVP_PKEY_meth_set_decrypt(*pmeth, NULL, pkey_gost_decrypt);
        EVP_PKEY_meth_set_derive(*pmeth,
                                 pkey_gost_derive_init, pkey_gost_ec_derive);
        EVP_PKEY_meth_set_paramgen(*pmeth,
                                   pkey_gost_paramgen_init,
                                   pkey_gost2012_paramgen);
    EVP_PKEY_meth_set_check(*pmeth, pkey_gost_check);
    EVP_PKEY_meth_set_public_check(*pmeth, pkey_gost_check);
        break;
    case NID_id_GostR3410_2012_512:
        EVP_PKEY_meth_set_ctrl(*pmeth,
                               pkey_gost_ctrl, pkey_gost_ec_ctrl_str_512);
        EVP_PKEY_meth_set_sign(*pmeth, NULL, pkey_gost_ec_cp_sign);
        EVP_PKEY_meth_set_verify(*pmeth, NULL, pkey_gost_ec_cp_verify);

        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost2012cp_keygen);

        EVP_PKEY_meth_set_encrypt(*pmeth,
                                  pkey_gost_encrypt_init,
                                  pkey_gost_encrypt);
        EVP_PKEY_meth_set_decrypt(*pmeth, NULL, pkey_gost_decrypt);
        EVP_PKEY_meth_set_derive(*pmeth,
                                 pkey_gost_derive_init, pkey_gost_ec_derive);
        EVP_PKEY_meth_set_paramgen(*pmeth,
                                   pkey_gost_paramgen_init,
                                   pkey_gost2012_paramgen);
    EVP_PKEY_meth_set_check(*pmeth, pkey_gost_check);
    EVP_PKEY_meth_set_public_check(*pmeth, pkey_gost_check);
        break;
    case NID_id_Gost28147_89_MAC:
        EVP_PKEY_meth_set_ctrl(*pmeth, pkey_gost_mac_ctrl,
                               pkey_gost_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx(*pmeth, pkey_gost_mac_signctx_init,
                                  pkey_gost_mac_signctx);
        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost_mac_keygen);
        EVP_PKEY_meth_set_init(*pmeth, pkey_gost_mac_init);
        EVP_PKEY_meth_set_cleanup(*pmeth, pkey_gost_mac_cleanup);
        EVP_PKEY_meth_set_copy(*pmeth, pkey_gost_mac_copy);
        return 1;
    case NID_gost_mac_12:
        EVP_PKEY_meth_set_ctrl(*pmeth, pkey_gost_mac_ctrl,
                               pkey_gost_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx(*pmeth, pkey_gost_mac_signctx_init,
                                  pkey_gost_mac_signctx);
        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost_mac_keygen_12);
        EVP_PKEY_meth_set_init(*pmeth, pkey_gost_mac_init);
        EVP_PKEY_meth_set_cleanup(*pmeth, pkey_gost_mac_cleanup);
        EVP_PKEY_meth_set_copy(*pmeth, pkey_gost_mac_copy);
        return 1;
    case NID_magma_mac:
        EVP_PKEY_meth_set_ctrl(*pmeth, pkey_gost_magma_mac_ctrl,
                               pkey_gost_magma_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx(*pmeth, pkey_gost_magma_mac_signctx_init,
                                  pkey_gost_mac_signctx);
        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost_magma_mac_keygen);
        EVP_PKEY_meth_set_init(*pmeth, pkey_gost_magma_mac_init);
        EVP_PKEY_meth_set_cleanup(*pmeth, pkey_gost_mac_cleanup);
        EVP_PKEY_meth_set_copy(*pmeth, pkey_gost_mac_copy);
        return 1;
    case NID_grasshopper_mac:
    case NID_id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm_omac: /* FIXME beldmit */
        EVP_PKEY_meth_set_ctrl(*pmeth, pkey_gost_grasshopper_mac_ctrl,
                               pkey_gost_grasshopper_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx(*pmeth, pkey_gost_grasshopper_mac_signctx_init,
                                  pkey_gost_mac_signctx);
        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost_grasshopper_mac_keygen);
        EVP_PKEY_meth_set_init(*pmeth, pkey_gost_grasshopper_mac_init);
        EVP_PKEY_meth_set_cleanup(*pmeth, pkey_gost_mac_cleanup);
        EVP_PKEY_meth_set_copy(*pmeth, pkey_gost_mac_copy);
        return 1;
    default:                   /* Unsupported method */
        return 0;
    }
    EVP_PKEY_meth_set_init(*pmeth, pkey_gost_init);
    EVP_PKEY_meth_set_cleanup(*pmeth, pkey_gost_cleanup);

    EVP_PKEY_meth_set_copy(*pmeth, pkey_gost_copy);
    /*
     * FIXME derive etc...
     */

    return 1;
}